

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

bool __thiscall google::protobuf::StringPiece::Consume(StringPiece *this,StringPiece x)

{
  long lVar1;
  int iVar2;
  size_t __n;
  bool bVar3;
  
  __n = x.length_;
  lVar1 = this->length_;
  if (lVar1 < (long)__n) {
    bVar3 = false;
  }
  else {
    iVar2 = bcmp(this->ptr_,x.ptr_,__n);
    bVar3 = iVar2 == 0;
  }
  if (bVar3 != false) {
    this->ptr_ = this->ptr_ + __n;
    this->length_ = lVar1 - __n;
  }
  return bVar3;
}

Assistant:

bool StringPiece::Consume(StringPiece x) {
  if (starts_with(x)) {
    ptr_ += x.length_;
    length_ -= x.length_;
    return true;
  }
  return false;
}